

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxin.cpp
# Opt level: O3

void __thiscall
ConfidentialTxIn_Constractor3_Test::TestBody(ConfidentialTxIn_Constractor3_Test *this)

{
  bool bVar1;
  uint32_t uVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_2;
  ConfidentialTxIn txin1;
  Txid local_1d8;
  string local_1b8;
  string local_198;
  internal local_178 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  ConfidentialTxIn local_168;
  
  cfd::core::ConfidentialTxIn::ConfidentialTxIn(&local_168,&exp_txid,2);
  uVar2 = cfd::core::AbstractTxIn::GetVout(&local_168.super_AbstractTxIn);
  local_1d8._vptr_Txid = (_func_int **)CONCAT44(local_1d8._vptr_Txid._4_4_,uVar2);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&local_1b8,"txin1.GetVout()","exp_index",(uint *)&local_1d8,&exp_index);
  if ((char)local_1b8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_1d8);
    if ((undefined8 *)local_1b8._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_1b8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x84,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_198,(Message *)&local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_198);
    if (local_1d8._vptr_Txid != (_func_int **)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_1d8._vptr_Txid != (_func_int **)0x0)) {
        (**(code **)(*local_1d8._vptr_Txid + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1b8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar2 = cfd::core::AbstractTxIn::GetSequence(&local_168.super_AbstractTxIn);
  local_1d8._vptr_Txid = (_func_int **)CONCAT44(local_1d8._vptr_Txid._4_4_,uVar2);
  local_198._M_dataplus._M_p._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_1b8,"txin1.GetSequence()","0",(uint *)&local_1d8,(int *)&local_198);
  if ((char)local_1b8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_1d8);
    if ((undefined8 *)local_1b8._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_1b8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x85,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_198,(Message *)&local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_198);
    if (local_1d8._vptr_Txid != (_func_int **)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_1d8._vptr_Txid != (_func_int **)0x0)) {
        (**(code **)(*local_1d8._vptr_Txid + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1b8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::AbstractTxIn::GetTxid(&local_1d8,&local_168.super_AbstractTxIn);
  cfd::core::Txid::GetHex_abi_cxx11_(&local_1b8,&local_1d8);
  pcVar3 = (char *)CONCAT71(local_1b8._M_dataplus._M_p._1_7_,(char)local_1b8._M_dataplus._M_p);
  cfd::core::Txid::GetHex_abi_cxx11_(&local_198,&exp_txid);
  testing::internal::CmpHelperSTREQ
            (local_178,"txin1.GetTxid().GetHex().c_str()","exp_txid.GetHex().c_str()",pcVar3,
             (char *)CONCAT44(local_198._M_dataplus._M_p._4_4_,local_198._M_dataplus._M_p._0_4_));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_198._M_dataplus._M_p._4_4_,local_198._M_dataplus._M_p._0_4_) !=
      &local_198.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_198._M_dataplus._M_p._4_4_,local_198._M_dataplus._M_p._0_4_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_1b8._M_dataplus._M_p._1_7_,(char)local_1b8._M_dataplus._M_p) !=
      &local_1b8.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_1b8._M_dataplus._M_p._1_7_,(char)local_1b8._M_dataplus._M_p));
  }
  local_1d8._vptr_Txid = (_func_int **)&PTR__Txid_00678d28;
  if (local_1d8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d8.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_178[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1b8);
    if (local_170.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_170.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x86,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d8,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d8);
    if (CONCAT71(local_1b8._M_dataplus._M_p._1_7_,(char)local_1b8._M_dataplus._M_p) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT71(local_1b8._M_dataplus._M_p._1_7_,(char)local_1b8._M_dataplus._M_p) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_1b8._M_dataplus._M_p._1_7_,
                                       (char)local_1b8._M_dataplus._M_p) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_170,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialTxIn::~ConfidentialTxIn(&local_168);
  return;
}

Assistant:

TEST(ConfidentialTxIn, Constractor3) {
  ConfidentialTxIn txin1(exp_txid, exp_index);
  EXPECT_EQ(txin1.GetVout(), exp_index);
  EXPECT_EQ(txin1.GetSequence(), 0);
  EXPECT_STREQ(txin1.GetTxid().GetHex().c_str(), exp_txid.GetHex().c_str());
}